

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t
check_bad_attrsz(_internal_exr_seq_scratch *scratch,int32_t attrsz,int32_t eltsize,char *aname,
                char *tname,int32_t *outsz)

{
  exr_result_t eVar1;
  undefined8 in_RAX;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  exr_const_context_t p_Var5;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  *outsz = attrsz;
  if (attrsz < 0) {
    p_Var5 = scratch->ctxt;
    UNRECOVERED_JUMPTABLE = p_Var5->print_error;
    pcVar3 = "Attribute \'%s\', type \'%s\': Invalid negative size %d";
  }
  else {
    uVar2 = (ulong)(uint)attrsz;
    p_Var5 = scratch->ctxt;
    if ((p_Var5->file_size < 1) ||
       (lVar4 = uVar2 - scratch->navail, lVar4 == 0 || (long)uVar2 < scratch->navail)) {
      if ((attrsz != 0x7fffffff) || ((long)uVar2 <= scratch->navail)) goto LAB_00128a85;
    }
    else if ((long)(lVar4 + scratch->fileoff) <= p_Var5->file_size) {
LAB_00128a85:
      if (1 < eltsize) {
        if (eltsize * ((uint)attrsz / (uint)eltsize) != attrsz) {
          eVar1 = (*p_Var5->print_error)
                            (p_Var5,0x11,
                             "Attribute \'%s\': Invalid size %d (exp \'%s\' size 4 * n, found odd bytes %d)"
                             ,aname,(ulong)(uint)attrsz,tname,
                             CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)attrsz % (uint)eltsize));
          return eVar1;
        }
        *outsz = (uint)attrsz / (uint)eltsize;
      }
      return 0;
    }
    UNRECOVERED_JUMPTABLE = p_Var5->print_error;
    pcVar3 = "Attribute \'%s\', type \'%s\': Invalid size %d";
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(p_Var5,0x11,pcVar3,aname,tname,(ulong)(uint)attrsz);
  return eVar1;
}

Assistant:

static exr_result_t
check_bad_attrsz (
    struct _internal_exr_seq_scratch* scratch,
    int32_t                           attrsz,
    int32_t                           eltsize,
    const char*                       aname,
    const char*                       tname,
    int32_t*                          outsz)
{
    int32_t n = attrsz;

    *outsz = n;
    if (attrsz < 0)
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid negative size %d",
            aname,
            tname,
            attrsz);

    if (scratch_attr_too_big (scratch, attrsz))
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid size %d",
            aname,
            tname,
            attrsz);

    if (eltsize > 1)
    {
        n = attrsz / eltsize;
        if (attrsz != (int32_t) (n * eltsize))
            return scratch->ctxt->print_error (
                scratch->ctxt,
                EXR_ERR_ATTR_SIZE_MISMATCH,
                "Attribute '%s': Invalid size %d (exp '%s' size 4 * n, found odd bytes %d)",
                aname,
                attrsz,
                tname,
                (attrsz % eltsize));
        *outsz = n;
    }

    return EXR_ERR_SUCCESS;
}